

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O1

void __thiscall OPLMIDIDevice::OPLMIDIDevice(OPLMIDIDevice *this,char *args)

{
  int lump;
  FWadLump data;
  FWadLump local_50;
  
  SoftSynthMIDIDevice::SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__OPLMIDIDevice_006f39f8;
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLMIDIDevice_006f3b00;
  OPL_SetCore(args);
  (this->super_OPLmusicBlock).FullPan = opl_fullpan.Value;
  lump = FWadCollection::GetNumForName(&Wads,"GENMIDI",0);
  FWadCollection::OpenLumpNum(&local_50,&Wads,lump);
  musicBlock::OPLloadBank(&(this->super_OPLmusicBlock).super_musicBlock,&local_50.super_FileReader);
  (this->super_SoftSynthMIDIDevice).SampleRate = 0xc234;
  FWadLump::~FWadLump(&local_50);
  return;
}

Assistant:

OPLMIDIDevice::OPLMIDIDevice(const char *args)
{
	OPL_SetCore(args);
	FullPan = opl_fullpan;
	FWadLump data = Wads.OpenLumpName("GENMIDI");
	OPLloadBank(data);
	SampleRate = (int)OPL_SAMPLE_RATE;
}